

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obudec.c
# Opt level: O3

int obudec_read_temporal_unit
              (ObuDecInputContext *obu_ctx,uint8_t **buffer,size_t *bytes_read,size_t *buffer_size)

{
  uint8_t **obu_buffer;
  size_t *obu_buffer_capacity;
  _Bool _Var1;
  int iVar2;
  uint8_t *puVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  undefined1 buffered;
  AvxInputContext *pAVar7;
  size_t sVar8;
  ulong uVar9;
  size_t length_of_temporal_unit_size;
  size_t bytes_read_1;
  size_t local_80;
  ObuHeader local_78;
  size_t *local_58;
  uint8_t tuheader [8];
  size_t *bytes_read_00;
  
  pAVar7 = obu_ctx->avx_ctx;
  if (pAVar7->file != (FILE *)0x0) {
    *buffer_size = 0;
    *bytes_read = 0;
    _Var1 = input_eof(pAVar7);
    if (_Var1) {
      return 1;
    }
    length_of_temporal_unit_size = 0;
    tuheader[0] = '\0';
    tuheader[1] = '\0';
    tuheader[2] = '\0';
    tuheader[3] = '\0';
    tuheader[4] = '\0';
    tuheader[5] = '\0';
    tuheader[6] = '\0';
    tuheader[7] = '\0';
    local_58 = bytes_read;
    if (obu_ctx->is_annexb == 0) {
      local_78.has_extension = 0;
      local_78.temporal_layer_id = 0;
      local_78.spatial_layer_id = 0;
      local_78._28_4_ = 0;
      local_78.size = 0;
      local_78.type = 0;
      local_78._9_3_ = 0;
      local_78.has_size_field = 0;
      pAVar7 = obu_ctx->avx_ctx;
      if (pAVar7 != (AvxInputContext *)0x0) {
        obu_buffer = &obu_ctx->buffer;
        obu_buffer_capacity = &obu_ctx->buffer_capacity;
        sVar8 = obu_ctx->bytes_buffered;
        do {
          local_78.spatial_layer_id = 0;
          local_78._28_4_ = 0;
          local_78.has_extension = 0;
          local_78.temporal_layer_id = 0;
          local_78.type = 0;
          local_78._9_3_ = 0;
          local_78.has_size_field = 0;
          local_78.size = 0;
          puVar3 = *obu_buffer;
          if (puVar3 == (uint8_t *)0x0) break;
          bytes_read_1 = 0;
          local_80 = 0;
          uVar9 = *obu_buffer_capacity;
          uVar6 = uVar9 - sVar8;
          if (uVar6 < 0x12) {
            if (uVar9 < 0x13) {
              uVar9 = 0x12;
            }
            iVar2 = obudec_grow_buffer(uVar9,obu_buffer,obu_buffer_capacity);
            if (iVar2 != 0) break;
            uVar9 = *obu_buffer_capacity;
            if (uVar9 < 0x13) {
              uVar9 = 0x12;
            }
            uVar6 = uVar6 + uVar9;
            puVar3 = *obu_buffer;
          }
          bytes_read_00 = &bytes_read_1;
          iVar2 = obudec_read_obu_header_and_size
                            (pAVar7,uVar6,0,puVar3 + sVar8,bytes_read_00,&local_80,&local_78,false);
          buffered = SUB81(bytes_read_00,0);
          if ((iVar2 < 0) || (CARRY8(bytes_read_1,local_80))) break;
          if (0x10000000 < local_80) {
            fprintf(_stderr,"obudec: Read invalid OBU size (%u)\n");
            break;
          }
          if (uVar6 < bytes_read_1 + local_80) {
            sVar4 = local_80;
            if (local_80 < *obu_buffer_capacity) {
              sVar4 = *obu_buffer_capacity;
            }
            iVar2 = obudec_grow_buffer(sVar4,obu_buffer,obu_buffer_capacity);
            if (iVar2 != 0) break;
          }
          if ((local_80 != 0) &&
             (iVar2 = obudec_read_obu_payload
                                (pAVar7,local_80,*obu_buffer + bytes_read_1 + sVar8,&bytes_read_1,
                                 (_Bool)buffered), iVar2 != 0)) break;
          uVar9 = obu_ctx->bytes_buffered;
          if ((local_78.type == OBU_TEMPORAL_DELIMITER) || (bytes_read_1 == 0)) {
            sVar5 = bytes_read_1;
            if (0x200000000 < uVar9) {
              obudec_read_temporal_unit_cold_6();
              return -1;
            }
            goto LAB_0012356e;
          }
          sVar8 = uVar9 + bytes_read_1;
          obu_ctx->bytes_buffered = sVar8;
          local_78.has_extension = 0;
          local_78.temporal_layer_id = 0;
          local_78.spatial_layer_id = 0;
          local_78._28_4_ = 0;
          local_78.size = 0;
          local_78.type = 0;
          local_78._9_3_ = 0;
          local_78.has_size_field = 0;
          pAVar7 = obu_ctx->avx_ctx;
        } while (pAVar7 != (AvxInputContext *)0x0);
      }
      obudec_read_temporal_unit_cold_7();
    }
    else {
      local_78.size = 0;
      if (obu_ctx->bytes_buffered == 0) {
        iVar2 = obudec_read_leb128(obu_ctx->avx_ctx,tuheader,&length_of_temporal_unit_size,
                                   &local_78.size,false);
        if (iVar2 != 0) {
          obudec_read_temporal_unit_cold_2();
          return -1;
        }
        if ((local_78.size == 0) && (_Var1 = input_eof(obu_ctx->avx_ctx), _Var1)) {
          return 1;
        }
      }
      else {
        iVar2 = aom_uleb_decode(obu_ctx->buffer,obu_ctx->bytes_buffered,&local_78.size,
                                &length_of_temporal_unit_size);
        if (iVar2 != 0) {
          obudec_read_temporal_unit_cold_1();
          return -1;
        }
      }
      if ((local_78.size >> 0x20 == 0) &&
         (uVar9 = local_78.size + length_of_temporal_unit_size, uVar9 >> 0x20 == 0)) {
        sVar5 = 0;
LAB_0012356e:
        if (uVar9 != 0) {
          puVar3 = (uint8_t *)realloc(*buffer,uVar9);
          if (puVar3 == (uint8_t *)0x0) {
            obudec_read_temporal_unit_cold_4();
            return -1;
          }
          *buffer = puVar3;
        }
        *local_58 = uVar9;
        *buffer_size = uVar9;
        if (obu_ctx->is_annexb == 0) {
          memcpy(*buffer,obu_ctx->buffer,uVar9);
          memmove(obu_ctx->buffer,obu_ctx->buffer + obu_ctx->bytes_buffered,sVar5);
          obu_ctx->bytes_buffered = sVar5;
          return 0;
        }
        _Var1 = input_eof(obu_ctx->avx_ctx);
        sVar8 = length_of_temporal_unit_size;
        if (_Var1) {
          return 0;
        }
        uVar6 = obu_ctx->bytes_buffered;
        if (uVar6 == 0) {
          memcpy(*buffer,tuheader,length_of_temporal_unit_size);
          sVar5 = length_of_temporal_unit_size;
        }
        else {
          sVar8 = uVar6;
          if (uVar9 <= uVar6) {
            sVar8 = uVar9;
          }
          memcpy(*buffer,obu_ctx->buffer,sVar8);
          obu_ctx->bytes_buffered = obu_ctx->bytes_buffered - sVar8;
          sVar5 = sVar8;
        }
        sVar4 = read_from_input(obu_ctx->avx_ctx,uVar9 - sVar8,*buffer + sVar5);
        if (sVar4 == uVar9 - sVar8) {
          return 0;
        }
        obudec_read_temporal_unit_cold_5();
      }
      else {
        obudec_read_temporal_unit_cold_3();
      }
    }
  }
  return -1;
}

Assistant:

int obudec_read_temporal_unit(struct ObuDecInputContext *obu_ctx,
                              uint8_t **buffer, size_t *bytes_read,
                              size_t *buffer_size) {
  FILE *f = obu_ctx->avx_ctx->file;
  if (!f) return -1;

  *buffer_size = 0;
  *bytes_read = 0;

  if (input_eof(obu_ctx->avx_ctx)) {
    return 1;
  }

  size_t tu_size;
  size_t obu_size = 0;
  size_t length_of_temporal_unit_size = 0;
  uint8_t tuheader[OBU_MAX_LENGTH_FIELD_SIZE] = { 0 };

  if (obu_ctx->is_annexb) {
    uint64_t size = 0;

    if (obu_ctx->bytes_buffered == 0) {
      if (obudec_read_leb128(obu_ctx->avx_ctx, &tuheader[0],
                             &length_of_temporal_unit_size, &size,
                             /*buffered=*/false) != 0) {
        fprintf(stderr, "obudec: Failure reading temporal unit header\n");
        return -1;
      }
      if (size == 0 && input_eof(obu_ctx->avx_ctx)) {
        return 1;
      }
    } else {
      // temporal unit size was already stored in buffer
      if (aom_uleb_decode(obu_ctx->buffer, obu_ctx->bytes_buffered, &size,
                          &length_of_temporal_unit_size) != 0) {
        fprintf(stderr, "obudec: Failure reading temporal unit header\n");
        return -1;
      }
    }

    if (size > UINT32_MAX || size + length_of_temporal_unit_size > UINT32_MAX) {
      fprintf(stderr, "obudec: TU too large.\n");
      return -1;
    }

    size += length_of_temporal_unit_size;
    tu_size = (size_t)size;
  } else {
    while (1) {
      ObuHeader obu_header;
      memset(&obu_header, 0, sizeof(obu_header));

      if (obudec_read_one_obu(obu_ctx->avx_ctx, &obu_ctx->buffer,
                              obu_ctx->bytes_buffered,
                              &obu_ctx->buffer_capacity, &obu_size, &obu_header,
                              0, /*buffered=*/false) != 0) {
        fprintf(stderr, "obudec: read_one_obu failed in TU loop\n");
        return -1;
      }

      if (obu_header.type == OBU_TEMPORAL_DELIMITER || obu_size == 0) {
        tu_size = obu_ctx->bytes_buffered;
        break;
      } else {
        obu_ctx->bytes_buffered += obu_size;
      }
    }
  }

#if defined AOM_MAX_ALLOCABLE_MEMORY
  if (tu_size > AOM_MAX_ALLOCABLE_MEMORY) {
    fprintf(stderr, "obudec: Temporal Unit size exceeds max alloc size.\n");
    return -1;
  }
#endif
  if (tu_size > 0) {
    uint8_t *new_buffer = (uint8_t *)realloc(*buffer, tu_size);
    if (!new_buffer) {
      free(*buffer);
      fprintf(stderr, "obudec: Out of memory.\n");
      return -1;
    }
    *buffer = new_buffer;
  }
  *bytes_read = tu_size;
  *buffer_size = tu_size;

  if (!obu_ctx->is_annexb) {
    memcpy(*buffer, obu_ctx->buffer, tu_size);

    // At this point, (obu_ctx->buffer + obu_ctx->bytes_buffered + obu_size)
    // points to the end of the buffer.
    memmove(obu_ctx->buffer, obu_ctx->buffer + obu_ctx->bytes_buffered,
            obu_size);
    obu_ctx->bytes_buffered = obu_size;
  } else {
    if (!input_eof(obu_ctx->avx_ctx)) {
      size_t data_size;
      size_t offset;
      if (!obu_ctx->bytes_buffered) {
        data_size = tu_size - length_of_temporal_unit_size;
        memcpy(*buffer, &tuheader[0], length_of_temporal_unit_size);
        offset = length_of_temporal_unit_size;
      } else {
        const size_t copy_size = AOMMIN(obu_ctx->bytes_buffered, tu_size);
        memcpy(*buffer, obu_ctx->buffer, copy_size);
        offset = copy_size;
        data_size = tu_size - copy_size;
        obu_ctx->bytes_buffered -= copy_size;
      }

      if (read_from_input(obu_ctx->avx_ctx, data_size, *buffer + offset) !=
          data_size) {
        fprintf(stderr, "obudec: Failed to read full temporal unit\n");
        return -1;
      }
    }
  }
  return 0;
}